

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.h
# Opt level: O0

void __thiscall VC1StreamReader::VC1StreamReader(VC1StreamReader *this)

{
  VC1StreamReader *this_local;
  
  MPEGStreamReader::MPEGStreamReader(&this->super_MPEGStreamReader);
  (this->super_MPEGStreamReader).super_AbstractStreamReader.super_BaseAbstractStreamReader.
  _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__VC1StreamReader_004426f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_entryPointBuffer);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_seqBuffer);
  VC1SequenceHeader::VC1SequenceHeader(&this->m_sequence);
  VC1Frame::VC1Frame(&this->m_frame);
  this->m_isFirstFrame = true;
  this->m_spsFound = 0;
  (this->m_frame).pict_type = I_TYPE;
  this->m_lastIFrame = false;
  this->m_decodedAfterSeq = false;
  this->m_firstFileFrame = false;
  this->m_prevDtsInc = 0;
  (this->super_MPEGStreamReader).m_longCodesAllowed = false;
  this->m_nextFrameAddr = (uint8_t *)0x0;
  return;
}

Assistant:

VC1StreamReader()
    {
        m_isFirstFrame = true;
        m_spsFound = 0;
        m_frame.pict_type = VC1PictType::I_TYPE;
        m_lastIFrame = false;
        m_decodedAfterSeq = false;
        m_firstFileFrame = false;
        m_prevDtsInc = false;
        m_longCodesAllowed = false;
        m_nextFrameAddr = nullptr;
    }